

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

int lws_ws_rx_sm(lws *wsi,char already_processed,uchar c)

{
  byte bVar1;
  uint32_t uVar2;
  uchar *puVar3;
  _lws_websocket_related *p_Var4;
  ushort uVar5;
  int iVar6;
  int local_54;
  int n;
  int ret;
  uchar *pp;
  unsigned_short close_code;
  lws_ext_pm_deflate_rx_ebufs pmdrx;
  int callback_action;
  uchar c_local;
  char already_processed_local;
  lws *wsi_local;
  
  pmdrx.eb_out.len = 6;
  local_54 = 0;
  pmdrx.eb_in.len = 0;
  pmdrx.eb_in._12_4_ = 0;
  pmdrx.eb_out.token._0_4_ = 0;
  if ((*(ulong *)&wsi->field_0x2dc >> 0xc & 1) != 0) {
    return -1;
  }
  switch(wsi->lws_rx_parse_state) {
  case '\0':
    if (wsi->ws->ietf_spec_revision != '\r') {
      _lws_log(2,"lws_ws_rx_sm: unknown spec version %d\n",(ulong)wsi->ws->ietf_spec_revision);
      return 0;
    }
    *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb | 4;
    goto LAB_0012a3c8;
  case '\x01':
    wsi->ws->mask[1] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x02';
    break;
  case '\x02':
    wsi->ws->mask[2] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x03';
    break;
  case '\x03':
    wsi->ws->mask[3] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->ws->mask_idx = '\0';
    wsi->lws_rx_parse_state = '\x04';
    break;
  case '\x04':
LAB_0012a3c8:
    wsi->ws->opcode = c & 0xf;
    wsi->ws->rsv = c & 0x70;
    *(ushort *)&wsi->ws->field_0x95 =
         *(ushort *)&wsi->ws->field_0x95 & 0xfffe | (ushort)((int)(uint)c >> 7 != 0);
    *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xf7ff;
    if (((wsi->ws->opcode & 8) != 0) && ((*(ushort *)&wsi->ws->field_0x95 & 1) == 0)) {
      lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"frag ctl",8);
      return -1;
    }
    switch(wsi->ws->opcode) {
    case '\0':
      if ((*(ushort *)&wsi->ws->field_0x95 >> 8 & 1) == 0) {
        lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"bad cont",8);
        return -1;
      }
      break;
    case '\x01':
      *(ushort *)&wsi->ws->field_0x95 =
           *(ushort *)&wsi->ws->field_0x95 & 0xfbff |
           (ushort)((wsi->context->options & 0x100) == 0x100) << 10;
    case '\x02':
      if (wsi->ws->opcode == '\x02') {
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfbff;
      }
      if ((*(ushort *)&wsi->ws->field_0x95 >> 8 & 1) != 0) {
        lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"bad cont",8);
        return -1;
      }
      wsi->ws->rsv_first_msg = c & 0x70;
      *(ushort *)&wsi->ws->field_0x95 =
           *(ushort *)&wsi->ws->field_0x95 & 0xfffd | (ushort)(wsi->ws->opcode == '\x02') << 1;
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xbfff | 0x4000;
      *(ushort *)&wsi->ws->field_0x95 =
           *(ushort *)&wsi->ws->field_0x95 & 0xfeff |
           (ushort)((*(ushort *)&wsi->ws->field_0x95 & 1) == 0) << 8;
      break;
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
      lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"bad opc",7);
      _lws_log(8,"illegal opcode\n");
      return -1;
    case '\b':
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfbff;
      wsi->ws->utf8 = '\0';
    }
    if (((*(ushort *)&wsi->ws->field_0x95 >> 9 & 1) != 0) &&
       ((wsi->ws->opcode == '\x01' || (wsi->ws->opcode == '\x02')))) {
      _lws_log(8,"hey you owed us a FIN\n");
      lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"bad fin",7);
      return -1;
    }
    if (((wsi->ws->opcode & 8) == 0) && ((*(ushort *)&wsi->ws->field_0x95 & 1) != 0)) {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfeff;
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfdff;
    }
    if ((*(ushort *)&wsi->ws->field_0x95 & 1) == 0) {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfdff | 0x200;
    }
    wsi->lws_rx_parse_state = '\x05';
    if ((wsi->ws->rsv != '\0') && ((wsi->ws->rsv & 0xbf) != 0)) {
      lws_close_reason(wsi,LWS_CLOSE_STATUS_PROTOCOL_ERR,(uchar *)"rsv bits",8);
      return -1;
    }
    break;
  case '\x05':
    *(ushort *)&wsi->ws->field_0x95 =
         (*(ushort *)&wsi->ws->field_0x95 & 0xfff7) + (ushort)(c >> 7) * 8;
    if ((c & 0x7f) == 0x7e) {
      if ((wsi->ws->opcode & 8) == 0) {
        wsi->lws_rx_parse_state = '\x06';
        return 0;
      }
LAB_0012b800:
      _lws_log(2,"Control frame with xtended length is illegal\n");
      return -1;
    }
    if ((c & 0x7f) == 0x7f) {
      if ((wsi->ws->opcode & 8) == 0) {
        wsi->lws_rx_parse_state = '\b';
        return 0;
      }
      goto LAB_0012b800;
    }
    wsi->ws->rx_packet_length = (long)(int)(c & 0x7f);
    if ((*(ushort *)&wsi->ws->field_0x95 >> 3 & 1) != 0) {
      wsi->lws_rx_parse_state = '\x10';
      return 0;
    }
    if (wsi->ws->rx_packet_length != 0) {
      wsi->lws_rx_parse_state = '\x14';
      return 0;
    }
    wsi->lws_rx_parse_state = '\0';
    goto LAB_0012b02a;
  case '\x06':
    wsi->ws->rx_packet_length = (long)(int)((uint)c << 8);
    wsi->lws_rx_parse_state = '\a';
    break;
  case '\a':
    wsi->ws->rx_packet_length = (ulong)c | wsi->ws->rx_packet_length;
    if ((*(ushort *)&wsi->ws->field_0x95 >> 3 & 1) == 0) {
      wsi->lws_rx_parse_state = '\x14';
    }
    else {
      wsi->lws_rx_parse_state = '\x10';
    }
    break;
  case '\b':
    if ((c & 0x80) != 0) {
      _lws_log(2,"b63 of length must be zero\n");
      return -1;
    }
    wsi->ws->rx_packet_length = (ulong)c << 0x38;
    wsi->lws_rx_parse_state = '\t';
    break;
  case '\t':
    wsi->ws->rx_packet_length = (ulong)c << 0x30 | wsi->ws->rx_packet_length;
    wsi->lws_rx_parse_state = '\n';
    break;
  case '\n':
    wsi->ws->rx_packet_length = (ulong)c << 0x28 | wsi->ws->rx_packet_length;
    wsi->lws_rx_parse_state = '\v';
    break;
  case '\v':
    wsi->ws->rx_packet_length = (ulong)c << 0x20 | wsi->ws->rx_packet_length;
    wsi->lws_rx_parse_state = '\f';
    break;
  case '\f':
    wsi->ws->rx_packet_length = (ulong)c << 0x18 | wsi->ws->rx_packet_length;
    wsi->lws_rx_parse_state = '\r';
    break;
  case '\r':
    wsi->ws->rx_packet_length = (ulong)c << 0x10 | wsi->ws->rx_packet_length;
    wsi->lws_rx_parse_state = '\x0e';
    break;
  case '\x0e':
    wsi->ws->rx_packet_length = (ulong)c << 8 | wsi->ws->rx_packet_length;
    wsi->lws_rx_parse_state = '\x0f';
    break;
  case '\x0f':
    wsi->ws->rx_packet_length = (ulong)c | wsi->ws->rx_packet_length;
    if ((*(ushort *)&wsi->ws->field_0x95 >> 3 & 1) == 0) {
      wsi->lws_rx_parse_state = '\x14';
    }
    else {
      wsi->lws_rx_parse_state = '\x10';
    }
    break;
  case '\x10':
    wsi->ws->mask[0] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x11';
    break;
  case '\x11':
    wsi->ws->mask[1] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x12';
    break;
  case '\x12':
    wsi->ws->mask[2] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x13';
    break;
  case '\x13':
    wsi->ws->mask[3] = c;
    if (c != '\0') {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xfffb;
    }
    wsi->lws_rx_parse_state = '\x14';
    wsi->ws->mask_idx = '\0';
    if (wsi->ws->rx_packet_length != 0) {
      return 0;
    }
    wsi->lws_rx_parse_state = '\0';
    goto LAB_0012b02a;
  case '\x14':
    if (wsi->ws->rx_ubuf == (uchar *)0x0) {
      __assert_fail("wsi->ws->rx_ubuf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                    ,0x186,"int lws_ws_rx_sm(struct lws *, char, unsigned char)");
    }
    if (wsi->ws->rx_ubuf_alloc <= wsi->ws->rx_ubuf_head + 0x10) {
      _lws_log(1,"Attempted overflow \n");
      return -1;
    }
    if ((already_processed & 1U) == 0) {
      if ((*(ushort *)&wsi->ws->field_0x95 >> 2 & 1) == 0) {
        p_Var4 = wsi->ws;
        bVar1 = wsi->ws->mask_idx;
        wsi->ws->mask_idx = bVar1 + 1;
        bVar1 = p_Var4->mask[(int)(bVar1 & 3)];
        puVar3 = wsi->ws->rx_ubuf;
        uVar2 = wsi->ws->rx_ubuf_head;
        wsi->ws->rx_ubuf_head = uVar2 + 1;
        puVar3[uVar2 + 0x10] = c ^ bVar1;
      }
      else {
        puVar3 = wsi->ws->rx_ubuf;
        uVar2 = wsi->ws->rx_ubuf_head;
        wsi->ws->rx_ubuf_head = uVar2 + 1;
        puVar3[uVar2 + 0x10] = c;
      }
      wsi->ws->rx_packet_length = wsi->ws->rx_packet_length - 1;
    }
    if (wsi->ws->rx_packet_length == 0) {
      _lws_log(0x10,"%s: ws fragment length exhausted\n","lws_ws_rx_sm");
      wsi->lws_rx_parse_state = '\0';
    }
    else {
      if ((wsi->protocol->rx_buffer_size == 0) &&
         (wsi->ws->rx_ubuf_head != wsi->context->pt_serv_buf_size)) {
        return 0;
      }
      if ((wsi->protocol->rx_buffer_size != 0) &&
         ((ulong)wsi->ws->rx_ubuf_head != wsi->protocol->rx_buffer_size)) {
        return 0;
      }
    }
LAB_0012b02a:
    _lws_log(0x20,"spill on %s\n",wsi->protocol->name);
    switch(wsi->ws->opcode) {
    case '\0':
    case '\x01':
    case '\x02':
      break;
    default:
      _lws_log(0x20,"unknown opc %x\n",(ulong)wsi->ws->opcode);
      return -1;
    case '\b':
      if (-1 < *(short *)&wsi->ws->field_0x95) {
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0x7fff | 0x8000;
        puVar3 = wsi->ws->rx_ubuf;
        if ((((wsi->context->options & 0x100) == 0x100) && (2 < wsi->ws->rx_ubuf_head)) &&
           (iVar6 = lws_check_utf8(&wsi->ws->utf8,puVar3 + 0x12,(ulong)(wsi->ws->rx_ubuf_head - 2)),
           iVar6 != 0)) {
LAB_0012b6ce:
          _lws_log(4,"utf8 error\n");
          lwsl_hexdump_level(4,(void *)pmdrx.eb_in._8_8_,(long)(int)(uint32_t)pmdrx.eb_out.token);
          return -1;
        }
        if ((wsi->wsistate & 0xffff) == 0x11d) {
          _lws_log(0x20,"seen client close ack\n");
          return -1;
        }
        if ((wsi->wsistate & 0xffff) == 0x11c) {
          return -1;
        }
        iVar6 = lws_partial_buffered(wsi);
        if (iVar6 != 0) {
          *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffffefff | 0x1000;
          _lws_log(0x20,"Closing on peer close due to pending tx\n");
          return -1;
        }
        if ((1 < wsi->ws->rx_ubuf_head) &&
           (((((uVar5 = CONCAT11(puVar3[0x10],puVar3[0x11]), uVar5 < 1000 || (uVar5 == 0x3ec)) ||
              ((uVar5 == 0x3ed || ((uVar5 == 0x3ee || (uVar5 == 0x3f4)))))) || (uVar5 == 0x3f5)) ||
            (((uVar5 == 0x3f6 || (uVar5 == 0x3f7)) || ((0x3f7 < uVar5 && (uVar5 < 3000)))))))) {
          puVar3[0x10] = '\x03';
          puVar3[0x11] = 0xea;
        }
        iVar6 = user_callback_handle_rxflow
                          (wsi->protocol->callback,wsi,LWS_CALLBACK_WS_PEER_INITIATED_CLOSE,
                           wsi->user_space,wsi->ws->rx_ubuf + 0x10,(ulong)wsi->ws->rx_ubuf_head);
        if (iVar6 != 0) {
          return -1;
        }
        _lws_log(0x20,"server sees client close packet\n");
        lwsi_set_state(wsi,0x11c);
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xffbf | 0x40;
        goto LAB_0012b3a6;
      }
      break;
    case '\t':
      _lws_log(8,"received %d byte ping, sending pong\n",(ulong)wsi->ws->rx_ubuf_head);
      if ((*(ushort *)&wsi->ws->field_0x95 >> 7 & 1) != 0) {
        _lws_log(0x20,"DROP PING since one pending\n");
        goto LAB_0012b45f;
      }
LAB_0012b3a6:
      if (wsi->ws->rx_ubuf_head < 0x7e) {
        memcpy(wsi->ws->ping_payload_buf + 0x10,wsi->ws->rx_ubuf + 0x10,(ulong)wsi->ws->rx_ubuf_head
              );
        wsi->ws->ping_payload_len = (uint8_t)wsi->ws->rx_ubuf_head;
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xff7f | 0x80;
        lws_callback_on_writable(wsi);
      }
      else {
        _lws_log(0x20,"DROP PING payload too large\n");
      }
LAB_0012b45f:
      wsi->ws->rx_ubuf_head = 0;
      return 0;
    case '\n':
      _lws_log(8,"received pong\n");
      lwsl_hexdump(wsi->ws->rx_ubuf + 0x10,(ulong)wsi->ws->rx_ubuf_head);
      lws_validity_confirmed(wsi);
      pmdrx.eb_out.len = 7;
    }
    pmdrx.eb_in._8_8_ = wsi->ws->rx_ubuf + 0x10;
    pmdrx.eb_out.token._0_4_ = wsi->ws->rx_ubuf_head;
    pmdrx.eb_in.token._0_4_ = (uint32_t)pmdrx.eb_out.token;
    if (wsi->ws->opcode != '\n') goto LAB_0012b560;
    while ((uint32_t)pmdrx.eb_in.token != 0) {
LAB_0012b560:
      if (((wsi->wsistate & 0xffff) == 0x11c) || ((wsi->wsistate & 0xffff) == 0x11d)) break;
      _lws_log(0x10,"%s: post ext ret %d, ebuf in %d / out %d\n","lws_ws_rx_sm",1,
               (ulong)(uint32_t)pmdrx.eb_in.token,(uint32_t)pmdrx.eb_out.token);
      if (((uint32_t)pmdrx.eb_out.token != 0) &&
         (((*(ushort *)&wsi->ws->field_0x95 >> 10 & 1) != 0 &&
          ((*(ushort *)&wsi->ws->field_0x95 >> 0xb & 1) == 0)))) {
        iVar6 = lws_check_utf8(&wsi->ws->utf8,(uchar *)pmdrx.eb_in._8_8_,
                               (long)(int)(uint32_t)pmdrx.eb_out.token);
        if (iVar6 != 0) {
          lws_close_reason(wsi,LWS_CLOSE_STATUS_INVALID_PAYLOAD,(uchar *)"bad utf8",8);
          goto LAB_0012b6ce;
        }
        if (((wsi->ws->rx_packet_length == 0) && ((*(ushort *)&wsi->ws->field_0x95 & 1) != 0)) &&
           (wsi->ws->utf8 != '\0')) {
          _lws_log(8,"FINAL utf8 error\n");
          lws_close_reason(wsi,LWS_CLOSE_STATUS_INVALID_PAYLOAD,(uchar *)"partial utf8",0xc);
          goto LAB_0012b6ce;
        }
      }
      pmdrx.eb_in.token._0_4_ = (uint32_t)pmdrx.eb_in.token - (uint32_t)pmdrx.eb_out.token;
      if ((wsi->wsistate_pre_close == 0) &&
         ((-1 < (int)(uint32_t)pmdrx.eb_out.token || (pmdrx.eb_out.len == 7)))) {
        if ((uint32_t)pmdrx.eb_out.token != 0) {
          *(uchar *)(pmdrx.eb_in._8_8_ + (long)(int)(uint32_t)pmdrx.eb_out.token) = '\0';
        }
        if ((wsi->protocol->callback != (lws_callback_function *)0x0) &&
           ((already_processed & 2U) == 0)) {
          if (pmdrx.eb_out.len == 7) {
            _lws_log(8,"Doing pong callback\n");
          }
          local_54 = user_callback_handle_rxflow
                               (wsi->protocol->callback,wsi,pmdrx.eb_out.len,wsi->user_space,
                                (void *)pmdrx.eb_in._8_8_,(long)(int)(uint32_t)pmdrx.eb_out.token);
        }
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xbfff;
      }
    }
    wsi->ws->rx_ubuf_head = 0;
  }
  return local_54;
}

Assistant:

int
lws_ws_rx_sm(struct lws *wsi, char already_processed, unsigned char c)
{
	int callback_action = LWS_CALLBACK_RECEIVE;
	struct lws_ext_pm_deflate_rx_ebufs pmdrx;
	unsigned short close_code;
	unsigned char *pp;
	int ret = 0;
	int n = 0;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	int rx_draining_ext = 0;
	int lin;
#endif

	pmdrx.eb_in.token = NULL;
	pmdrx.eb_in.len = 0;
	pmdrx.eb_out.token = NULL;
	pmdrx.eb_out.len = 0;

	if (wsi->socket_is_permanently_unusable)
		return -1;

	switch (wsi->lws_rx_parse_state) {
	case LWS_RXPS_NEW:
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			pmdrx.eb_in.token = NULL;
			pmdrx.eb_in.len = 0;
			pmdrx.eb_out.token = NULL;
			pmdrx.eb_out.len = 0;
			lws_remove_wsi_from_draining_ext_list(wsi);
			rx_draining_ext = 1;
			lwsl_debug("%s: doing draining flow\n", __func__);

			goto drain_extension;
		}
#endif
		switch (wsi->ws->ietf_spec_revision) {
		case 13:
			/*
			 * no prepended frame key any more
			 */
			wsi->ws->all_zero_nonce = 1;
			goto handle_first;

		default:
			lwsl_warn("lws_ws_rx_sm: unknown spec version %d\n",
				  wsi->ws->ietf_spec_revision);
			break;
		}
		break;
	case LWS_RXPS_04_mask_1:
		wsi->ws->mask[1] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_04_mask_2;
		break;
	case LWS_RXPS_04_mask_2:
		wsi->ws->mask[2] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_04_mask_3;
		break;
	case LWS_RXPS_04_mask_3:
		wsi->ws->mask[3] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;

		/*
		 * start from the zero'th byte in the XOR key buffer since
		 * this is the start of a frame with a new key
		 */

		wsi->ws->mask_idx = 0;

		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_1;
		break;

	/*
	 *  04 logical framing from the spec (all this is masked when incoming
	 *  and has to be unmasked)
	 *
	 * We ignore the possibility of extension data because we don't
	 * negotiate any extensions at the moment.
	 *
	 *    0                   1                   2                   3
	 *    0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1 2 3 4 5 6 7 8 9 0 1
	 *   +-+-+-+-+-------+-+-------------+-------------------------------+
	 *   |F|R|R|R| opcode|R| Payload len |    Extended payload length    |
	 *   |I|S|S|S|  (4)  |S|     (7)     |             (16/63)           |
	 *   |N|V|V|V|       |V|             |   (if payload len==126/127)   |
	 *   | |1|2|3|       |4|             |                               |
	 *   +-+-+-+-+-------+-+-------------+ - - - - - - - - - - - - - - - +
	 *   |     Extended payload length continued, if payload len == 127  |
	 *   + - - - - - - - - - - - - - - - +-------------------------------+
	 *   |                               |         Extension data        |
	 *   +-------------------------------+ - - - - - - - - - - - - - - - +
	 *   :                                                               :
	 *   +---------------------------------------------------------------+
	 *   :                       Application data                        :
	 *   +---------------------------------------------------------------+
	 *
	 *  We pass payload through to userland as soon as we get it, ignoring
	 *  FIN.  It's up to userland to buffer it up if it wants to see a
	 *  whole unfragmented block of the original size (which may be up to
	 *  2^63 long!)
	 */

	case LWS_RXPS_04_FRAME_HDR_1:
handle_first:

		wsi->ws->opcode = c & 0xf;
		wsi->ws->rsv = c & 0x70;
		wsi->ws->final = !!((c >> 7) & 1);
		wsi->ws->defeat_check_utf8 = 0;

		if (((wsi->ws->opcode) & 8) && !wsi->ws->final) {
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"frag ctl", 8);
			return -1;
		}

		switch (wsi->ws->opcode) {
		case LWSWSOPC_TEXT_FRAME:
			wsi->ws->check_utf8 = lws_check_opt(
				wsi->context->options,
				LWS_SERVER_OPTION_VALIDATE_UTF8);
			/* fallthru */
		case LWSWSOPC_BINARY_FRAME:
			if (wsi->ws->opcode == LWSWSOPC_BINARY_FRAME)
				wsi->ws->check_utf8 = 0;
			if (wsi->ws->continuation_possible) {
				lws_close_reason(wsi,
					LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad cont", 8);
				return -1;
			}
			wsi->ws->rsv_first_msg = (c & 0x70);
#if !defined(LWS_WITHOUT_EXTENSIONS)
			/*
			 *  set the expectation that we will have to
			 * fake up the zlib trailer to the inflator for this
			 * frame
			 */
			wsi->ws->pmd_trailer_application = !!(c & 0x40);
#endif
			wsi->ws->frame_is_binary =
			     wsi->ws->opcode == LWSWSOPC_BINARY_FRAME;
			wsi->ws->first_fragment = 1;
			wsi->ws->continuation_possible = !wsi->ws->final;
			break;
		case LWSWSOPC_CONTINUATION:
			if (!wsi->ws->continuation_possible) {
				lws_close_reason(wsi,
					LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad cont", 8);
				return -1;
			}
			break;
		case LWSWSOPC_CLOSE:
			wsi->ws->check_utf8 = 0;
			wsi->ws->utf8 = 0;
			break;
		case 3:
		case 4:
		case 5:
		case 6:
		case 7:
		case 0xb:
		case 0xc:
		case 0xd:
		case 0xe:
		case 0xf:
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad opc", 7);
			lwsl_info("illegal opcode\n");
			return -1;
		}

		if (wsi->ws->owed_a_fin &&
		    (wsi->ws->opcode == LWSWSOPC_TEXT_FRAME ||
		     wsi->ws->opcode == LWSWSOPC_BINARY_FRAME)) {
			lwsl_info("hey you owed us a FIN\n");
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					(uint8_t *)"bad fin", 7);
			return -1;
		}
		if ((!(wsi->ws->opcode & 8)) && wsi->ws->final) {
			wsi->ws->continuation_possible = 0;
			wsi->ws->owed_a_fin = 0;
		}

		if (!wsi->ws->final)
			wsi->ws->owed_a_fin = 1;

		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN;
		if (wsi->ws->rsv &&
		    (
#if !defined(LWS_WITHOUT_EXTENSIONS)
				    !wsi->ws->count_act_ext ||
#endif
				    (wsi->ws->rsv & ~0x40))) {
			lws_close_reason(wsi, LWS_CLOSE_STATUS_PROTOCOL_ERR,
					 (uint8_t *)"rsv bits", 8);
			return -1;
		}
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN:

		wsi->ws->this_frame_masked = !!(c & 0x80);

		switch (c & 0x7f) {
		case 126:
			/* control frames are not allowed to have big lengths */
			if (wsi->ws->opcode & 8)
				goto illegal_ctl_length;

			wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN16_2;
			break;
		case 127:
			/* control frames are not allowed to have big lengths */
			if (wsi->ws->opcode & 8)
				goto illegal_ctl_length;

			wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_8;
			break;
		default:
			wsi->ws->rx_packet_length = c & 0x7f;


			if (wsi->ws->this_frame_masked)
				wsi->lws_rx_parse_state =
						LWS_RXPS_07_COLLECT_FRAME_KEY_1;
			else
				if (wsi->ws->rx_packet_length) {
					wsi->lws_rx_parse_state =
					LWS_RXPS_WS_FRAME_PAYLOAD;
				} else {
					wsi->lws_rx_parse_state = LWS_RXPS_NEW;
					goto spill;
				}
			break;
		}
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN16_2:
		wsi->ws->rx_packet_length = c << 8;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN16_1;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN16_1:
		wsi->ws->rx_packet_length |= c;
		if (wsi->ws->this_frame_masked)
			wsi->lws_rx_parse_state =
					LWS_RXPS_07_COLLECT_FRAME_KEY_1;
		else {
			wsi->lws_rx_parse_state =
				LWS_RXPS_WS_FRAME_PAYLOAD;
		}
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_8:
		if (c & 0x80) {
			lwsl_warn("b63 of length must be zero\n");
			/* kill the connection */
			return -1;
		}
#if defined __LP64__
		wsi->ws->rx_packet_length = ((size_t)c) << 56;
#else
		wsi->ws->rx_packet_length = 0;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_7;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_7:
#if defined __LP64__
		wsi->ws->rx_packet_length |= ((size_t)c) << 48;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_6;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_6:
#if defined __LP64__
		wsi->ws->rx_packet_length |= ((size_t)c) << 40;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_5;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_5:
#if defined __LP64__
		wsi->ws->rx_packet_length |= ((size_t)c) << 32;
#endif
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_4;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_4:
		wsi->ws->rx_packet_length |= ((size_t)c) << 24;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_3;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_3:
		wsi->ws->rx_packet_length |= ((size_t)c) << 16;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_2;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_2:
		wsi->ws->rx_packet_length |= ((size_t)c) << 8;
		wsi->lws_rx_parse_state = LWS_RXPS_04_FRAME_HDR_LEN64_1;
		break;

	case LWS_RXPS_04_FRAME_HDR_LEN64_1:
		wsi->ws->rx_packet_length |= ((size_t)c);
		if (wsi->ws->this_frame_masked)
			wsi->lws_rx_parse_state =
					LWS_RXPS_07_COLLECT_FRAME_KEY_1;
		else
			wsi->lws_rx_parse_state = LWS_RXPS_WS_FRAME_PAYLOAD;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_1:
		wsi->ws->mask[0] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_07_COLLECT_FRAME_KEY_2;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_2:
		wsi->ws->mask[1] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_07_COLLECT_FRAME_KEY_3;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_3:
		wsi->ws->mask[2] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_07_COLLECT_FRAME_KEY_4;
		break;

	case LWS_RXPS_07_COLLECT_FRAME_KEY_4:
		wsi->ws->mask[3] = c;
		if (c)
			wsi->ws->all_zero_nonce = 0;
		wsi->lws_rx_parse_state = LWS_RXPS_WS_FRAME_PAYLOAD;
		wsi->ws->mask_idx = 0;
		if (wsi->ws->rx_packet_length == 0) {
			wsi->lws_rx_parse_state = LWS_RXPS_NEW;
			goto spill;
		}
		break;


	case LWS_RXPS_WS_FRAME_PAYLOAD:
		assert(wsi->ws->rx_ubuf);

		if (wsi->ws->rx_ubuf_head + LWS_PRE >= wsi->ws->rx_ubuf_alloc) {
			lwsl_err("Attempted overflow \n");
			return -1;
		}
		if (!(already_processed & ALREADY_PROCESSED_IGNORE_CHAR)) {
			if (wsi->ws->all_zero_nonce)
				wsi->ws->rx_ubuf[LWS_PRE +
				                 (wsi->ws->rx_ubuf_head++)] = c;
			else
				wsi->ws->rx_ubuf[LWS_PRE +
				                 (wsi->ws->rx_ubuf_head++)] =
				   c ^ wsi->ws->mask[(wsi->ws->mask_idx++) & 3];

			--wsi->ws->rx_packet_length;
		}

		if (!wsi->ws->rx_packet_length) {
			lwsl_debug("%s: ws fragment length exhausted\n",
				   __func__);
			/* spill because we have the whole frame */
			wsi->lws_rx_parse_state = LWS_RXPS_NEW;
			goto spill;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			lwsl_debug("%s: UNTIL_EXHAUSTED draining\n", __func__);
			goto drain_extension;
		}
#endif
		/*
		 * if there's no protocol max frame size given, we are
		 * supposed to default to context->pt_serv_buf_size
		 */
		if (!wsi->protocol->rx_buffer_size &&
		    wsi->ws->rx_ubuf_head != wsi->context->pt_serv_buf_size)
			break;

		if (wsi->protocol->rx_buffer_size &&
		    wsi->ws->rx_ubuf_head != wsi->protocol->rx_buffer_size)
			break;

		/* spill because we filled our rx buffer */
spill:
		/*
		 * is this frame a control packet we should take care of at this
		 * layer?  If so service it and hide it from the user callback
		 */

		lwsl_parser("spill on %s\n", wsi->protocol->name);

		switch (wsi->ws->opcode) {
		case LWSWSOPC_CLOSE:

			if (wsi->ws->peer_has_sent_close)
				break;

			wsi->ws->peer_has_sent_close = 1;

			pp = &wsi->ws->rx_ubuf[LWS_PRE];
			if (lws_check_opt(wsi->context->options,
					  LWS_SERVER_OPTION_VALIDATE_UTF8) &&
			    wsi->ws->rx_ubuf_head > 2 &&
			    lws_check_utf8(&wsi->ws->utf8, pp + 2,
					   wsi->ws->rx_ubuf_head - 2))
				goto utf8_fail;

			/* is this an acknowledgment of our close? */
			if (lwsi_state(wsi) == LRS_AWAITING_CLOSE_ACK) {
				/*
				 * fine he has told us he is closing too, let's
				 * finish our close
				 */
				lwsl_parser("seen client close ack\n");
				return -1;
			}
			if (lwsi_state(wsi) == LRS_RETURNED_CLOSE)
				/* if he sends us 2 CLOSE, kill him */
				return -1;

			if (lws_partial_buffered(wsi)) {
				/*
				 * if we're in the middle of something,
				 * we can't do a normal close response and
				 * have to just close our end.
				 */
				wsi->socket_is_permanently_unusable = 1;
				lwsl_parser("Closing on peer close "
					    "due to pending tx\n");
				return -1;
			}

			if (wsi->ws->rx_ubuf_head >= 2) {
				close_code = (pp[0] << 8) | pp[1];
				if (close_code < 1000 ||
				    close_code == 1004 ||
				    close_code == 1005 ||
				    close_code == 1006 ||
				    close_code == 1012 ||
				    close_code == 1013 ||
				    close_code == 1014 ||
				    close_code == 1015 ||
				    (close_code >= 1016 && close_code < 3000)
				) {
					pp[0] = (LWS_CLOSE_STATUS_PROTOCOL_ERR >> 8) & 0xff;
					pp[1] = LWS_CLOSE_STATUS_PROTOCOL_ERR & 0xff;
				}
			}

			if (user_callback_handle_rxflow(
					wsi->protocol->callback, wsi,
					LWS_CALLBACK_WS_PEER_INITIATED_CLOSE,
					wsi->user_space,
					&wsi->ws->rx_ubuf[LWS_PRE],
					wsi->ws->rx_ubuf_head))
				return -1;

			lwsl_parser("server sees client close packet\n");
			lwsi_set_state(wsi, LRS_RETURNED_CLOSE);
			/* deal with the close packet contents as a PONG */
			wsi->ws->payload_is_close = 1;
			goto process_as_ping;

		case LWSWSOPC_PING:
			lwsl_info("received %d byte ping, sending pong\n",
						 (int)wsi->ws->rx_ubuf_head);

			if (wsi->ws->ping_pending_flag) {
				/*
				 * there is already a pending ping payload
				 * we should just log and drop
				 */
				lwsl_parser("DROP PING since one pending\n");
				goto ping_drop;
			}
process_as_ping:
			/* control packets can only be < 128 bytes long */
			if (wsi->ws->rx_ubuf_head > 128 - 3) {
				lwsl_parser("DROP PING payload too large\n");
				goto ping_drop;
			}

			/* stash the pong payload */
			memcpy(wsi->ws->ping_payload_buf + LWS_PRE,
			       &wsi->ws->rx_ubuf[LWS_PRE],
				wsi->ws->rx_ubuf_head);

			wsi->ws->ping_payload_len = wsi->ws->rx_ubuf_head;
			wsi->ws->ping_pending_flag = 1;

			/* get it sent as soon as possible */
			lws_callback_on_writable(wsi);
ping_drop:
			wsi->ws->rx_ubuf_head = 0;
			return 0;

		case LWSWSOPC_PONG:
			lwsl_info("received pong\n");
			lwsl_hexdump(&wsi->ws->rx_ubuf[LWS_PRE],
			             wsi->ws->rx_ubuf_head);

			lws_validity_confirmed(wsi);

			/* issue it */
			callback_action = LWS_CALLBACK_RECEIVE_PONG;
			break;

		case LWSWSOPC_TEXT_FRAME:
		case LWSWSOPC_BINARY_FRAME:
		case LWSWSOPC_CONTINUATION:
			break;

		default:
			lwsl_parser("unknown opc %x\n", wsi->ws->opcode);

			return -1;
		}

		/*
		 * No it's real payload, pass it up to the user callback.
		 *
		 * We have been statefully collecting it in the
		 * LWS_RXPS_WS_FRAME_PAYLOAD clause above.
		 *
		 * It's nicely buffered with the pre-padding taken care of
		 * so it can be sent straight out again using lws_write.
		 *
		 * However, now we have a chunk of it, we want to deal with it
		 * all here.  Since this may be input to permessage-deflate and
		 * there are block limits on that for input and output, we may
		 * need to iterate.
		 */

		pmdrx.eb_in.token = &wsi->ws->rx_ubuf[LWS_PRE];
		pmdrx.eb_in.len = wsi->ws->rx_ubuf_head;

		/* for the non-pm-deflate case */

		pmdrx.eb_out = pmdrx.eb_in;

		if (wsi->ws->opcode == LWSWSOPC_PONG && !pmdrx.eb_in.len)
			goto already_done;
#if !defined(LWS_WITHOUT_EXTENSIONS)
drain_extension:
#endif

		do {

//			lwsl_notice("%s: pmdrx.eb_in.len: %d\n", __func__,
//					(int)pmdrx.eb_in.len);

			if (lwsi_state(wsi) == LRS_RETURNED_CLOSE ||
			    lwsi_state(wsi) == LRS_AWAITING_CLOSE_ACK)
				goto already_done;

			n = PMDR_DID_NOTHING;

#if !defined(LWS_WITHOUT_EXTENSIONS)
			lin = pmdrx.eb_in.len;
			//if (lin)
			//	lwsl_hexdump_notice(ebuf.token, ebuf.len);
			lwsl_ext("%s: +++ passing %d %p to ext\n", __func__,
					pmdrx.eb_in.len, pmdrx.eb_in.token);

			n = lws_ext_cb_active(wsi, LWS_EXT_CB_PAYLOAD_RX, &pmdrx, 0);
			lwsl_debug("%s: ext says %d / ebuf.len %d\n", __func__,
				   n, pmdrx.eb_out.len);
			if (wsi->ws->rx_draining_ext)
				already_processed &= ~ALREADY_PROCESSED_NO_CB;
#endif

			/*
			 * ebuf may be pointing somewhere completely different
			 * now, it's the output
			 */
#if !defined(LWS_WITHOUT_EXTENSIONS)
			if (n < 0) {
				/*
				 * we may rely on this to get RX, just drop
				 * connection
				 */
				wsi->socket_is_permanently_unusable = 1;
				return -1;
			}
			if (n == PMDR_DID_NOTHING)
				break;
#endif
			lwsl_debug("%s: post ext ret %d, ebuf in %d / out %d\n",
				    __func__, n, pmdrx.eb_in.len,
				    pmdrx.eb_out.len);

#if !defined(LWS_WITHOUT_EXTENSIONS)
			if (rx_draining_ext && !pmdrx.eb_out.len) {
				lwsl_debug("   --- ending drain on 0 read\n");
				goto already_done;
			}

			if (n == PMDR_HAS_PENDING)
				/*
				 * extension had more...
				 * main loop will come back
				 */
				lws_add_wsi_to_draining_ext_list(wsi);
			else
				lws_remove_wsi_from_draining_ext_list(wsi);

			rx_draining_ext = wsi->ws->rx_draining_ext;
#endif

			if (pmdrx.eb_out.len &&
			    wsi->ws->check_utf8 && !wsi->ws->defeat_check_utf8) {
				if (lws_check_utf8(&wsi->ws->utf8,
						   pmdrx.eb_out.token,
						   pmdrx.eb_out.len)) {
					lws_close_reason(wsi,
						LWS_CLOSE_STATUS_INVALID_PAYLOAD,
						(uint8_t *)"bad utf8", 8);
					goto utf8_fail;
				}

				/* we are ending partway through utf-8 character? */
				if (!wsi->ws->rx_packet_length &&
				    wsi->ws->final && wsi->ws->utf8
#if !defined(LWS_WITHOUT_EXTENSIONS)
				    /* if ext not negotiated, going to be UNKNOWN */
				    && (n == PMDR_EMPTY_FINAL || n == PMDR_UNKNOWN)
#endif
				) {
					lwsl_info("FINAL utf8 error\n");
					lws_close_reason(wsi,
						LWS_CLOSE_STATUS_INVALID_PAYLOAD,
						(uint8_t *)"partial utf8", 12);
utf8_fail:
					lwsl_notice("utf8 error\n");
					lwsl_hexdump_notice(pmdrx.eb_out.token,
							    pmdrx.eb_out.len);

					return -1;
				}
			}

			/* if pmd not enabled, in == out */

			if (n == PMDR_DID_NOTHING
#if !defined(LWS_WITHOUT_EXTENSIONS)
				       	||
			    n == PMDR_UNKNOWN
#endif
			    )
				pmdrx.eb_in.len -= pmdrx.eb_out.len;

	if (!wsi->wsistate_pre_close &&
			    (pmdrx.eb_out.len >= 0 ||
			     callback_action == LWS_CALLBACK_RECEIVE_PONG ||
						       n == PMDR_EMPTY_FINAL)) {
				if (pmdrx.eb_out.len)
					pmdrx.eb_out.token[pmdrx.eb_out.len] = '\0';

				if (wsi->protocol->callback &&
				    !(already_processed & ALREADY_PROCESSED_NO_CB)) {
					if (callback_action ==
						      LWS_CALLBACK_RECEIVE_PONG)
						lwsl_info("Doing pong callback\n");

					ret = user_callback_handle_rxflow(
						wsi->protocol->callback, wsi,
						(enum lws_callback_reasons)
							     callback_action,
						wsi->user_space,
						pmdrx.eb_out.token,
						pmdrx.eb_out.len);
				}
				wsi->ws->first_fragment = 0;
			}

#if !defined(LWS_WITHOUT_EXTENSIONS)
			if (!lin)
				break;
#endif

		} while (pmdrx.eb_in.len
#if !defined(LWS_WITHOUT_EXTENSIONS)
				|| rx_draining_ext
#endif
		);

already_done:
		wsi->ws->rx_ubuf_head = 0;
		break;
	}

	return ret;

illegal_ctl_length:

	lwsl_warn("Control frame with xtended length is illegal\n");
	/* kill the connection */
	return -1;
}